

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

bool JSON::ExtractString(wchar_t **data,wstring *str)

{
  bool bVar1;
  uint uVar2;
  wstring *in_RSI;
  long *in_RDI;
  int i;
  wchar_t next_char;
  int local_20;
  wchar_t local_1c;
  
  std::__cxx11::wstring::operator=(in_RSI,L"");
  do {
    if (*(int *)*in_RDI == 0) {
      return false;
    }
    local_1c = *(wchar_t *)*in_RDI;
    if (local_1c == L'\\') {
      *in_RDI = *in_RDI + 4;
      switch(*(undefined4 *)*in_RDI) {
      case 0x22:
        local_1c = L'\"';
        break;
      default:
        return false;
      case 0x2f:
        local_1c = L'/';
        break;
      case 0x5c:
        local_1c = L'\\';
        break;
      case 0x62:
        local_1c = L'\b';
        break;
      case 0x66:
        local_1c = L'\f';
        break;
      case 0x6e:
        local_1c = L'\n';
        break;
      case 0x72:
        local_1c = L'\r';
        break;
      case 0x74:
        local_1c = L'\t';
        break;
      case 0x75:
        bVar1 = simplejson_wcsnlen((wchar_t *)*in_RDI,5);
        if (!bVar1) {
          return false;
        }
        local_1c = L'\0';
        for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
          *in_RDI = *in_RDI + 4;
          if ((*(int *)*in_RDI < 0x30) || (0x39 < *(int *)*in_RDI)) {
            if ((*(int *)*in_RDI < 0x41) || (0x46 < *(int *)*in_RDI)) {
              if ((*(int *)*in_RDI < 0x61) || (0x66 < *(int *)*in_RDI)) {
                return false;
              }
              uVar2 = *(int *)*in_RDI - 0x57;
            }
            else {
              uVar2 = *(int *)*in_RDI - 0x37;
            }
          }
          else {
            uVar2 = *(int *)*in_RDI - 0x30;
          }
          local_1c = uVar2 | local_1c << 4;
        }
      }
    }
    else {
      if (local_1c == L'\"') {
        *in_RDI = *in_RDI + 4;
        std::__cxx11::wstring::reserve();
        return true;
      }
      if ((local_1c < L' ') && (local_1c != L'\t')) {
        return false;
      }
    }
    std::__cxx11::wstring::operator+=(in_RSI,local_1c);
    *in_RDI = *in_RDI + 4;
  } while( true );
}

Assistant:

bool JSON::ExtractString(const wchar_t **data, std::wstring &str)
{
	str = L"";
	
	while (**data != 0)
	{
		// Save the char so we can change it if need be
		wchar_t next_char = **data;
		
		// Escaping something?
		if (next_char == L'\\')
		{
			// Move over the escape char
			(*data)++;
			
			// Deal with the escaped char
			switch (**data)
			{
				case L'"': next_char = L'"'; break;
				case L'\\': next_char = L'\\'; break;
				case L'/': next_char = L'/'; break;
				case L'b': next_char = L'\b'; break;
				case L'f': next_char = L'\f'; break;
				case L'n': next_char = L'\n'; break;
				case L'r': next_char = L'\r'; break;
				case L't': next_char = L'\t'; break;
				case L'u':
				{
					// We need 5 chars (4 hex + the 'u') or its not valid
					if (!simplejson_wcsnlen(*data, 5))
						return false;
					
					// Deal with the chars
					next_char = 0;
					for (int i = 0; i < 4; i++)
					{
						// Do it first to move off the 'u' and leave us on the
						// final hex digit as we move on by one later on
						(*data)++;
						
						next_char <<= 4;
						
						// Parse the hex digit
						if (**data >= '0' && **data <= '9')
							next_char |= (**data - '0');
						else if (**data >= 'A' && **data <= 'F')
							next_char |= (10 + (**data - 'A'));
						else if (**data >= 'a' && **data <= 'f')
							next_char |= (10 + (**data - 'a'));
						else
						{
							// Invalid hex digit = invalid JSON
							return false;
						}
					}
					break;
				}
				
				// By the spec, only the above cases are allowed
				default:
					return false;
			}
		}
		
		// End of the string?
		else if (next_char == L'"')
		{
			(*data)++;
			str.reserve(); // Remove unused capacity
			return true;
		}
		
		// Disallowed char?
		else if (next_char < L' ' && next_char != L'\t')
		{
			// SPEC Violation: Allow tabs due to real world cases
			return false;
		}
		
		// Add the next char
		str += next_char;
		
		// Move on
		(*data)++;
	}
	
	// If we're here, the string ended incorrectly
	return false;
}